

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erase(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        *this,pair<unsigned_long_long,_int> *key)

{
  node *pnVar1;
  ulong uVar2;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar3;
  _func_int *p_Var4;
  int iVar5;
  int iVar6;
  long lVar7;
  locType *pos;
  int *piVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar10;
  undefined8 *puVar11;
  uint uVar12;
  uint uVar13;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_00;
  undefined8 *puVar14;
  int iVar15;
  locType *plVar16;
  long lVar17;
  long lVar18;
  node **ppnVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 *local_60;
  locType *local_58;
  int local_4c;
  int *local_48;
  node **local_40;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_38;
  node *pnVar9;
  
  iVar5 = this->depth;
  lVar7 = (long)iVar5;
  if (lVar7 == 0) {
    return false;
  }
  puVar14 = &uStack_68;
  uVar20 = lVar7 * 8 + 8;
  if (iVar5 < -1) {
    uVar20 = 0xffffffffffffffff;
  }
  uVar21 = lVar7 * 4 + 4;
  if (iVar5 < -1) {
    uVar21 = 0xffffffffffffffff;
  }
  uStack_70 = 0x112d75;
  local_38 = this;
  pos = (locType *)operator_new__(uVar20);
  *pos = 0;
  uStack_70 = 0x112d87;
  local_40 = (node **)operator_new__(uVar20);
  uStack_70 = 0x112d93;
  piVar8 = (int *)operator_new__(uVar21);
  *pos = local_38->root;
  iVar5 = local_38->depth;
  if (0 < iVar5) {
    lVar7 = 0;
    local_48 = piVar8;
    do {
      uStack_70 = 0x112dc8;
      iVar5 = (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(local_38->file,pos + lVar7);
      pnVar9 = (node *)CONCAT44(extraout_var,iVar5);
      local_40[lVar7] = pnVar9;
      uVar12 = pnVar9->sz;
      bVar22 = 0 < (int)uVar12;
      if ((int)uVar12 < 1) {
        uVar21 = 0;
      }
      else {
        piVar8 = &pnVar9->keyvalue[0].second;
        uVar21 = 0;
        do {
          if ((key->first <= ((pair<unsigned_long_long,_int> *)(piVar8 + -2))->first) &&
             ((key->first < ((pair<unsigned_long_long,_int> *)(piVar8 + -2))->first ||
              (key->second <= *piVar8)))) goto LAB_00112e21;
          uVar21 = uVar21 + 1;
          bVar22 = uVar21 < uVar12;
          piVar8 = piVar8 + 4;
        } while (uVar12 != uVar21);
        uVar21 = (ulong)uVar12;
      }
LAB_00112e21:
      if (lVar7 < (long)local_38->depth + -1) {
        if (bVar22) {
          uVar20 = pnVar9->keyvalue[uVar21 & 0xffffffff].first;
          uVar12 = 0;
          if ((uVar20 <= key->first) && (uVar12 = 1, key->first <= uVar20)) {
            uVar12 = (uint)(pnVar9->keyvalue[uVar21 & 0xffffffff].second <= key->second);
          }
          uVar21 = (ulong)((int)uVar21 + uVar12);
        }
        (pos + lVar7)[1] = (pnVar9->field_0).val[(int)uVar21];
      }
      local_48[lVar7] = (int)uVar21;
      lVar7 = lVar7 + 1;
      iVar5 = local_38->depth;
      piVar8 = local_48;
    } while (lVar7 < iVar5);
  }
  pnVar9 = local_40[(long)iVar5 + -1];
  iVar6 = (int)uVar21;
  if (iVar6 != pnVar9->sz) {
    uVar20 = pnVar9->keyvalue[iVar6].first;
    if ((uVar20 <= key->first) &&
       ((uVar20 < key->first || (pnVar9->keyvalue[iVar6].second <= key->second)))) {
      if (1 < iVar5 && iVar6 == 0) {
        plVar16 = pos + (iVar5 - 2);
        lVar7 = (ulong)(iVar5 - 2) + 1;
        do {
          lVar17 = (long)piVar8[lVar7 + -1];
          if (lVar17 != 0) {
            uVar20 = pnVar9->keyvalue[0].first;
            pnVar1 = local_40[lVar7 + -1];
            uVar2 = pnVar1->keyvalue[lVar17 + -1].first;
            if (((uVar2 <= uVar20) && (uVar20 <= uVar2)) &&
               (pnVar1->keyvalue[lVar17 + -1].second == pnVar9->keyvalue[0].second)) {
              pnVar1->keyvalue[lVar17 + -1].first = pnVar9->keyvalue[1].first;
              pnVar1->keyvalue[lVar17 + -1].second = pnVar9->keyvalue[1].second;
              uStack_70 = 0x112f93;
              (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[3])(local_38->file,plVar16);
              break;
            }
          }
          plVar16 = plVar16 + -1;
          lVar17 = lVar7 + -1;
          bVar22 = 0 < lVar7;
          lVar7 = lVar17;
        } while (lVar17 != 0 && bVar22);
      }
      this_00 = local_38;
      ppnVar19 = local_40;
      pnVar9 = local_40[(long)iVar5 + -1];
      iVar15 = pnVar9->sz;
      if (iVar6 + 1 < iVar15) {
        lVar7 = (long)(iVar6 + 1);
        lVar17 = lVar7 * 0x10 + 0x330;
        do {
          iVar6 = (int)uVar21;
          pnVar9->keyvalue[iVar6].first = *(unsigned_long_long *)((long)pnVar9 + lVar17 + -8);
          pnVar9->keyvalue[iVar6].second = *(int *)((long)&pnVar9->field_0 + lVar17);
          (pnVar9->field_0).val[iVar6] = (pnVar9->field_0).val[lVar7];
          lVar7 = lVar7 + 1;
          pnVar9 = local_40[(long)iVar5 + -1];
          iVar15 = pnVar9->sz;
          uVar21 = (ulong)(iVar6 + 1);
          lVar17 = lVar17 + 0x10;
        } while (lVar7 < iVar15);
      }
      pnVar9->sz = iVar15 + -1;
      lVar7 = (long)local_38->depth;
      if (lVar7 == 1) {
        if (iVar15 + -1 == 0) {
          local_38->depth = 0;
          uStack_70 = 0x1130e1;
          DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          ::release(local_38->file,local_38->root);
          this_00->root = -1;
          puVar14 = &uStack_68;
          ppnVar19 = local_40;
        }
        else {
          uStack_70 = 0x113031;
          (*(local_38->file->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            )._vptr_FileManager_Base[3])(local_38->file,&local_38->root);
          puVar14 = &uStack_68;
          ppnVar19 = local_40;
        }
      }
      else if (iVar15 < 0x33) {
        iVar6 = piVar8[lVar7 + -2];
        pnVar9 = local_40[lVar7 + -2];
        local_48 = piVar8;
        if (iVar6 == pnVar9->sz) {
          local_40[lVar7] = local_40[lVar7 + -1];
          piVar8[lVar7] = piVar8[lVar7 + -2];
          pos[lVar7] = pos[lVar7 + -1];
          iVar6 = pnVar9->sz;
          piVar8[lVar7 + -2] = iVar6 + -1;
          pos[lVar7 + -1] = *(locType *)((long)pnVar9 + (long)iVar6 * 8 + -8);
          uStack_70 = 0x1130b8;
          iVar6 = (*(local_38->file->
                    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                    )._vptr_FileManager_Base[2])(local_38->file,pos + lVar7 + -1);
          local_40[(long)local_38->depth + -1] = (node *)CONCAT44(extraout_var_00,iVar6);
        }
        else {
          piVar8[lVar7] = iVar6 + 1;
          pos[lVar7] = *(locType *)((long)&local_40[lVar7 + -2]->field_0 + (long)iVar6 * 8 + 8);
          uStack_70 = 0x113111;
          iVar6 = (*(local_38->file->
                    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                    )._vptr_FileManager_Base[2])(local_38->file,pos + lVar7);
          local_40[local_38->depth] = (node *)CONCAT44(extraout_var_01,iVar6);
        }
        this_00 = local_38;
        ppnVar19 = local_40;
        iVar6 = local_38->depth;
        uVar12 = local_40[iVar6]->sz + local_40[(long)iVar5 + -1]->sz;
        if ((int)uVar12 < 100) {
          pnVar9 = local_40[iVar6];
          iVar15 = pnVar9->sz;
          if (0 < iVar15) {
            lVar7 = 0x66;
            lVar17 = 0;
            do {
              (local_40[(long)iVar5 + -1]->field_0).val[local_40[(long)iVar5 + -1]->sz + lVar17] =
                   (pnVar9->field_0).val[lVar17];
              pnVar9 = local_40[iVar6];
              pnVar1 = local_40[(long)iVar5 + -1];
              lVar18 = pnVar1->sz + lVar17;
              pnVar1->keyvalue[lVar18].first =
                   *(unsigned_long_long *)((long)pnVar9 + lVar7 * 8 + -8);
              pnVar1->keyvalue[lVar18].second = *(int *)((long)&pnVar9->field_0 + lVar7 * 8);
              lVar17 = lVar17 + 1;
              pnVar9 = local_40[iVar6];
              iVar15 = pnVar9->sz;
              lVar7 = lVar7 + 2;
            } while (lVar17 < iVar15);
          }
          pnVar1 = local_40[(long)iVar5 + -1];
          pnVar1->nxt = pnVar9->nxt;
          piVar8 = &pnVar1->sz;
          *piVar8 = *piVar8 + iVar15;
          uStack_70 = 0x1131e0;
          (*(local_38->file->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            )._vptr_FileManager_Base[3])(local_38->file,pos + (long)local_38->depth + -1);
          uStack_70 = 0x1131f0;
          DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          ::release(this_00->file,pos[this_00->depth]);
          piVar8 = local_48;
          uStack_68._4_4_ = this_00->depth + -2;
          uStack_70 = 0x113211;
          erasenonleaf(this_00,(int *)((long)&uStack_68 + 4),local_40,local_48,pos);
          ppnVar19 = local_40;
        }
        else {
          local_60 = (undefined1 *)&uStack_68;
          uVar20 = (ulong)uVar12;
          puVar10 = (undefined8 *)((long)&uStack_68 - (uVar20 * 8 + 0x17 & 0xfffffffffffffff0));
          puVar11 = puVar10 + uVar20 * -2;
          puVar14 = puVar11;
          do {
            *puVar14 = 0;
            *(undefined4 *)(puVar14 + 1) = 0;
            puVar14 = puVar14 + 2;
          } while (puVar14 != puVar10);
          local_58 = pos;
          pnVar9 = ppnVar19[iVar6];
          uVar21 = pnVar9->keyvalue[0].first;
          local_4c = pnVar9->keyvalue[0].second;
          pnVar1 = ppnVar19[(long)iVar5 + -1];
          iVar15 = pnVar1->sz;
          lVar7 = (long)iVar15;
          if (0 < lVar7) {
            lVar17 = 0;
            do {
              *(undefined8 *)((long)puVar10 + lVar17) =
                   *(undefined8 *)((long)&pnVar1->field_0 + lVar17);
              *(undefined8 *)((long)puVar11 + lVar17 * 2) =
                   *(undefined8 *)((long)&pnVar1->keyvalue[0].first + lVar17 * 2);
              *(undefined4 *)((long)puVar11 + lVar17 * 2 + 8) =
                   *(undefined4 *)((long)&pnVar1->keyvalue[0].second + lVar17 * 2);
              lVar17 = lVar17 + 8;
            } while (lVar7 * 8 - lVar17 != 0);
          }
          if (iVar15 < (int)uVar12) {
            lVar17 = uVar20 - lVar7;
            lVar18 = 0;
            do {
              *(undefined8 *)((long)puVar10 + lVar18 + lVar7 * 8) =
                   *(undefined8 *)((long)&pnVar9->field_0 + lVar18);
              *(undefined8 *)((long)puVar11 + lVar18 * 2 + lVar7 * 0x10) =
                   *(undefined8 *)((long)&pnVar9->keyvalue[0].first + lVar18 * 2);
              *(undefined4 *)((long)puVar11 + lVar18 * 2 + lVar7 * 0x10 + 8) =
                   *(undefined4 *)((long)&pnVar9->keyvalue[0].second + lVar18 * 2);
              lVar18 = lVar18 + 8;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
          ppnVar19 = local_40;
          pos = local_58;
          uVar13 = uVar12 + 1 >> 1;
          pnVar1->sz = uVar13;
          pnVar9->sz = uVar12 - uVar13;
          pnVar9 = local_40[(long)iVar5 + -1];
          if (0 < pnVar9->sz) {
            lVar7 = 0;
            lVar17 = 0;
            do {
              (pnVar9->field_0).val[lVar17] = puVar10[lVar17];
              pnVar9 = local_40[(long)iVar5 + -1];
              *(undefined8 *)((long)&pnVar9->keyvalue[0].first + lVar7) =
                   *(undefined8 *)((long)puVar11 + lVar7);
              *(undefined4 *)((long)&pnVar9->keyvalue[0].second + lVar7) =
                   *(undefined4 *)((long)puVar11 + lVar7 + 8);
              lVar17 = lVar17 + 1;
              pnVar9 = local_40[(long)iVar5 + -1];
              lVar7 = lVar7 + 0x10;
            } while (lVar17 < pnVar9->sz);
          }
          pnVar9 = local_40[iVar6];
          if (0 < pnVar9->sz) {
            lVar7 = 0x66;
            lVar17 = 0;
            do {
              (pnVar9->field_0).val[lVar17] = puVar10[local_40[(long)iVar5 + -1]->sz + lVar17];
              lVar18 = local_40[(long)iVar5 + -1]->sz + lVar17;
              pnVar9 = local_40[iVar6];
              *(undefined8 *)((long)pnVar9 + lVar7 * 8 + -8) = puVar11[lVar18 * 2];
              *(undefined4 *)((long)&pnVar9->field_0 + lVar7 * 8) =
                   *(undefined4 *)(puVar11 + lVar18 * 2 + 1);
              lVar17 = lVar17 + 1;
              pnVar9 = local_40[iVar6];
              lVar7 = lVar7 + 2;
            } while (lVar17 < pnVar9->sz);
          }
          pDVar3 = local_38->file;
          plVar16 = local_58 + (long)local_38->depth + -1;
          p_Var4 = (pDVar3->
                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                   )._vptr_FileManager_Base[3];
          puVar11[-1] = 0x113410;
          (*p_Var4)(pDVar3,plVar16);
          pDVar3 = local_38->file;
          iVar5 = local_38->depth;
          p_Var4 = (pDVar3->
                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                   )._vptr_FileManager_Base[3];
          puVar11[-1] = 0x113429;
          (*p_Var4)(pDVar3,pos + iVar5);
          this_00 = local_38;
          puVar14 = (undefined8 *)local_60;
          piVar8 = local_48;
          if (1 < local_38->depth) {
            uVar20 = (ulong)(local_38->depth - 2);
            plVar16 = pos + uVar20;
            lVar7 = uVar20 + 1;
            do {
              pnVar9 = ppnVar19[lVar7 + -1];
              iVar5 = local_48[lVar7 + -1];
              uVar20 = pnVar9->keyvalue[iVar5].first;
              if (((uVar20 <= uVar21) && (uVar21 <= uVar20)) &&
                 (pnVar9->keyvalue[iVar5].second == local_4c)) {
                pnVar1 = ppnVar19[iVar6];
                pnVar9->keyvalue[iVar5].first = pnVar1->keyvalue[0].first;
                pnVar9->keyvalue[iVar5].second = pnVar1->keyvalue[0].second;
                pDVar3 = local_38->file;
                p_Var4 = (pDVar3->
                         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                         )._vptr_FileManager_Base[3];
                puVar11[-1] = 0x1134a3;
                (*p_Var4)(pDVar3,plVar16);
                this_00 = local_38;
                puVar14 = (undefined8 *)local_60;
                ppnVar19 = local_40;
                piVar8 = local_48;
                break;
              }
              plVar16 = plVar16 + -1;
              lVar17 = lVar7 + -1;
              bVar22 = 0 < lVar7;
              lVar7 = lVar17;
            } while (lVar17 != 0 && bVar22);
          }
        }
      }
      else {
        uStack_70 = 0x113056;
        (*(local_38->file->
          super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          )._vptr_FileManager_Base[3])(local_38->file,pos + lVar7 + -1);
        puVar14 = &uStack_68;
      }
      *(undefined8 *)((long)puVar14 + -8) = 0x11321a;
      operator_delete__(ppnVar19);
      *(undefined8 *)((long)puVar14 + -8) = 0x113222;
      operator_delete__(piVar8);
      *(undefined8 *)((long)puVar14 + -8) = 0x11322a;
      operator_delete__(pos);
      this_00->siz = this_00->siz + -1;
      return true;
    }
  }
  uStack_70 = 0x112ece;
  operator_delete__(local_40);
  uStack_70 = 0x112ed6;
  operator_delete__(piVar8);
  uStack_70 = 0x112ede;
  operator_delete__(pos);
  return false;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }